

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_scaling.c
# Opt level: O2

cupdlp_retcode
scale_problem(CUPDLPcsc *csc,cupdlp_float *cost,cupdlp_float *lower,cupdlp_float *upper,
             cupdlp_float *rhs,cupdlp_float *col_scaling,cupdlp_float *row_scaling)

{
  cupdlp_int len;
  uint len_00;
  int iVar1;
  cupdlp_int *pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  len = csc->nRows;
  len_00 = csc->nCols;
  cupdlp_cdiv(cost,col_scaling,len_00);
  cupdlp_cdot(lower,col_scaling,len_00);
  cupdlp_cdot(upper,col_scaling,len_00);
  cupdlp_cdiv(rhs,row_scaling,len);
  pcVar2 = csc->colMatBeg;
  uVar5 = 0;
  uVar3 = (ulong)(uint)pcVar2[(int)len_00];
  if (pcVar2[(int)len_00] < 1) {
    uVar3 = uVar5;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    csc->colMatElem[uVar5] = csc->colMatElem[uVar5] / row_scaling[csc->colMatIdx[uVar5]];
  }
  uVar5 = 0;
  uVar3 = 0;
  if (0 < (int)len_00) {
    uVar5 = (ulong)len_00;
  }
  while (uVar4 = uVar3, uVar4 != uVar5) {
    iVar1 = pcVar2[uVar4 + 1];
    for (lVar6 = (long)pcVar2[uVar4]; uVar3 = uVar4 + 1, lVar6 < iVar1; lVar6 = lVar6 + 1) {
      csc->colMatElem[lVar6] = csc->colMatElem[lVar6] / col_scaling[uVar4];
    }
  }
  return 0;
}

Assistant:

cupdlp_retcode scale_problem(CUPDLPcsc *csc, cupdlp_float *cost,
                             cupdlp_float *lower, cupdlp_float *upper,
                             cupdlp_float *rhs, cupdlp_float *col_scaling,
                             cupdlp_float *row_scaling) {
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_int nRows = csc->nRows;
  cupdlp_int nCols = csc->nCols;

  cupdlp_cdiv(cost, col_scaling, nCols);
  cupdlp_cdot(lower, col_scaling, nCols);
  cupdlp_cdot(upper, col_scaling, nCols);
  cupdlp_cdiv(rhs, row_scaling, nRows);

  // row scaling
  for (int i = 0; i < csc->colMatBeg[nCols]; i++) {
    csc->colMatElem[i] /= row_scaling[csc->colMatIdx[i]];
  }
  // col scaling
  for (int i = 0; i < nCols; i++) {
    for (int j = csc->colMatBeg[i]; j < csc->colMatBeg[i + 1]; j++) {
      csc->colMatElem[j] /= col_scaling[i];
    }
  }

  // w->scaling->ifScaled = 1;

exit_cleanup:
  return retcode;
}